

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

BufferSp __thiscall
vkt::SpirVAssembly::getBuffer(SpirVAssembly *this,IntegerType type,deInt64 number)

{
  Buffer<int> *this_00;
  SharedPtrStateBase *pSVar1;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar2;
  allocator<int> local_3d;
  value_type_conflict5 local_3c;
  vector<int,_std::allocator<int>_> local_38;
  deInt64 local_20;
  deInt64 number_local;
  SpirVAssembly *pSStack_10;
  IntegerType type_local;
  
  local_20 = number;
  number_local._4_4_ = type;
  pSStack_10 = this;
  switch(type) {
  case INTEGER_TYPE_SIGNED_16:
    BVar2 = getSpecializedBuffer<short>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  case INTEGER_TYPE_SIGNED_32:
    BVar2 = getSpecializedBuffer<int>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  case INTEGER_TYPE_SIGNED_64:
    BVar2 = getSpecializedBuffer<long>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  case INTEGER_TYPE_UNSIGNED_16:
    BVar2 = getSpecializedBuffer<unsigned_short>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  case INTEGER_TYPE_UNSIGNED_32:
    BVar2 = getSpecializedBuffer<unsigned_int>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  case INTEGER_TYPE_UNSIGNED_64:
    BVar2 = getSpecializedBuffer<unsigned_long>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  default:
    this_00 = (Buffer<int> *)operator_new(0x20);
    local_3c = 0;
    std::allocator<int>::allocator(&local_3d);
    std::vector<int,_std::allocator<int>_>::vector(&local_38,1,&local_3c,&local_3d);
    Buffer<int>::Buffer(this_00,&local_38);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
    std::vector<int,_std::allocator<int>_>::~vector(&local_38);
    std::allocator<int>::~allocator(&local_3d);
    pSVar1 = extraout_RDX;
  }
  BVar2.m_state = pSVar1;
  BVar2.m_ptr = (BufferInterface *)this;
  return BVar2;
}

Assistant:

BufferSp getBuffer (IntegerType type, deInt64 number)
{
	switch (type)
	{
		case INTEGER_TYPE_SIGNED_16:	return getSpecializedBuffer<deInt16>(number);
		case INTEGER_TYPE_SIGNED_32:	return getSpecializedBuffer<deInt32>(number);
		case INTEGER_TYPE_SIGNED_64:	return getSpecializedBuffer<deInt64>(number);

		case INTEGER_TYPE_UNSIGNED_16:	return getSpecializedBuffer<deUint16>(number);
		case INTEGER_TYPE_UNSIGNED_32:	return getSpecializedBuffer<deUint32>(number);
		case INTEGER_TYPE_UNSIGNED_64:	return getSpecializedBuffer<deUint64>(number);

		default:						DE_ASSERT(false);
										return BufferSp(new Buffer<deInt32>(vector<deInt32>(1, 0)));
	}
}